

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolHashArray.c
# Opt level: O2

int * deTestHashArrayHash_find(deTestHashArrayHash *hash,deInt16 key)

{
  deInt16 *pdVar1;
  deTestHashArrayHashSlot *pdVar2;
  deUint32 dVar3;
  int *piVar4;
  deTestHashArrayHashSlot **ppdVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (0 < hash->numElements) {
    dVar3 = deInt16Hash(key);
    ppdVar5 = hash->slotTable + (int)(hash->slotTableSize - 1U & dVar3);
    while (pdVar2 = *ppdVar5, pdVar2 != (deTestHashArrayHashSlot *)0x0) {
      uVar6 = (ulong)(uint)pdVar2->numUsed;
      if (pdVar2->numUsed < 1) {
        uVar6 = 0;
      }
      piVar4 = (int *)(pdVar2->keys + 2);
      uVar7 = 0;
      while (uVar6 != uVar7) {
        piVar4 = piVar4 + 1;
        pdVar1 = pdVar2->keys + uVar7;
        uVar7 = uVar7 + 1;
        if (*pdVar1 == key) {
          return piVar4;
        }
      }
      ppdVar5 = &pdVar2->nextSlot;
    }
  }
  return (int *)0x0;
}

Assistant:

void dePoolHashArray_selfTest (void)
{
	deMemPool*			pool		= deMemPool_createRoot(DE_NULL, 0);
	deTestHashArray*	hashArray	= deTestHashArray_create(pool);
	deInt16Array*		keyArray	= deInt16Array_create(pool);
	deIntArray*			valueArray	= deIntArray_create(pool);
	int					iter;

	for (iter = 0; iter < 3; iter++)
	{
		int i;

		/* Insert a bunch of values. */
		DE_TEST_ASSERT(deTestHashArray_getNumElements(hashArray) == 0);
		for (i = 0; i < 20; i++)
		{
			deTestHashArray_insert(hashArray, (deInt16)(-i^0x5), 2*i+5);
		}
		DE_TEST_ASSERT(deTestHashArray_getNumElements(hashArray) == 20);

		deTestHashArray_copyToArray(hashArray, keyArray, DE_NULL);
		deTestHashArray_copyToArray(hashArray, DE_NULL, valueArray);
		DE_TEST_ASSERT(deInt16Array_getNumElements(keyArray) == 20);
		DE_TEST_ASSERT(deIntArray_getNumElements(valueArray) == 20);

		for (i = 0; i < 20; i++)
		{
			DE_TEST_ASSERT(deInt16Array_get(keyArray, i) == (deInt16)(-i^0x5));
			DE_TEST_ASSERT(deIntArray_get(valueArray, i) == 2*i+5);
		}

		deTestHashArray_reset(hashArray);
		DE_TEST_ASSERT(deTestHashArray_getNumElements(hashArray) == 0);

		deTestHashArray_copyToArray(hashArray, keyArray, DE_NULL);
		deTestHashArray_copyToArray(hashArray, DE_NULL, valueArray);

		DE_TEST_ASSERT(deInt16Array_getNumElements(keyArray) == 0);
		DE_TEST_ASSERT(deIntArray_getNumElements(valueArray) == 0);
	}

	deMemPool_destroy(pool);
}